

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatryoshkaUtil.cpp
# Opt level: O3

MatrixProperties *
parseSparseMatrix(MatrixProperties *__return_storage_ptr__,string *path,int resolution,string *chrom
                 )

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar1;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pmVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  void *pvVar4;
  double *pdVar5;
  istream *piVar6;
  ostream *poVar7;
  size_type i;
  reference pdVar8;
  long lVar9;
  int iVar10;
  size_type j;
  size_type sVar11;
  int n;
  int w;
  int v;
  int M;
  string line;
  double count;
  ifstream file;
  int local_28c;
  int local_288;
  int local_284;
  int local_280;
  int local_27c;
  string *local_278;
  undefined1 *local_270;
  undefined8 local_268;
  undefined1 local_260 [16];
  string *local_250;
  string *local_248;
  string *local_240;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *local_238;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_230 [3];
  int aiStack_218 [122];
  
  (__return_storage_ptr__->matrix).
  super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->matrix).
  super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->chrom)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->chrom).field_2;
  (__return_storage_ptr__->chrom)._M_string_length = 0;
  (__return_storage_ptr__->chrom).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->BI).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->BI).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->BI).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_27c = 0;
  local_288 = resolution;
  std::ifstream::ifstream(&local_238,(string *)path,_S_in);
  local_278 = chrom;
  local_250 = path;
  if (*(int *)((long)aiStack_218 + *(long *)&local_238[-1].data_) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Couldn\'t read file: ",0x14);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(local_250->_M_dataplus)._M_p,
                        local_250->_M_string_length);
    std::endl<char,std::char_traits<char>>(poVar7);
    exit(1);
  }
  local_240 = (string *)&__return_storage_ptr__->chrom;
  local_270 = local_260;
  local_268 = 0;
  local_260[0] = 0;
  iVar10 = 0;
  while( true ) {
    pvVar4 = (void *)std::istream::operator>>(&local_238,&local_280);
    pdVar5 = (double *)std::istream::operator>>(pvVar4,&local_284);
    piVar6 = std::istream::_M_extract<double>(pdVar5);
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
    if (iVar10 < local_280) {
      iVar10 = local_280;
    }
    if (iVar10 < local_284) {
      iVar10 = local_284;
    }
    local_27c = local_27c + 1;
  }
  local_28c = iVar10 / local_288 + 1;
  std::__cxx11::string::_M_assign(local_240);
  __return_storage_ptr__->resolution = local_288;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Building matrix for chromosome ",0x1f);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(__return_storage_ptr__->chrom)._M_dataplus._M_p,
                      (__return_storage_ptr__->chrom)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," at resolution ",0xf);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,__return_storage_ptr__->resolution);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"bp with ",8);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_28c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," rows.",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (local_270 != local_260) {
    operator_delete(local_270);
  }
  std::ifstream::~ifstream(&local_238);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Initializing matrix to zero elements",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  local_238 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,std::allocator<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>,int&,int&,int&>
            (a_Stack_230,&local_238,
             (allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
              *)&local_270,&local_28c,&local_28c,&local_27c);
  _Var3._M_pi = a_Stack_230[0]._M_pi;
  pmVar2 = local_238;
  local_238 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               *)0x0;
  a_Stack_230[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this = (__return_storage_ptr__->matrix).
         super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
  (__return_storage_ptr__->matrix).
  super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = pmVar2;
  (__return_storage_ptr__->matrix).
  super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var3._M_pi;
  if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
     a_Stack_230[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_230[0]._M_pi);
  }
  if (0 < local_28c) {
    sVar11 = 0;
    iVar10 = local_28c;
    do {
      if (iVar10 < 1) {
        lVar9 = (long)iVar10;
      }
      else {
        j = 0;
        do {
          peVar1 = (__return_storage_ptr__->matrix).
                   super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          i = boost::numeric::ublas::basic_row_major<unsigned_long,_long>::element
                        (sVar11,peVar1->size1_,j,peVar1->size2_);
          pdVar8 = boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::
                   operator[](&peVar1->data_,i);
          *pdVar8 = 0.0;
          j = j + 1;
          lVar9 = (long)local_28c;
          iVar10 = local_28c;
        } while ((long)j < lVar9);
      }
      sVar11 = sVar11 + 1;
    } while ((long)sVar11 < lVar9);
  }
  std::ifstream::ifstream(&local_238,(string *)local_250,_S_in);
  local_270 = local_260;
  local_268 = 0;
  local_260[0] = 0;
  while( true ) {
    pvVar4 = (void *)std::istream::operator>>(&local_238,&local_280);
    pdVar5 = (double *)std::istream::operator>>(pvVar4,&local_284);
    piVar6 = std::istream::_M_extract<double>(pdVar5);
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
    peVar1 = (__return_storage_ptr__->matrix).
             super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_278 = local_248;
    sVar11 = boost::numeric::ublas::basic_row_major<unsigned_long,_long>::element
                       ((long)(local_280 / local_288),peVar1->size1_,(long)(local_284 / local_288),
                        peVar1->size2_);
    pdVar8 = boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::operator[]
                       (&peVar1->data_,sVar11);
    *pdVar8 = (double)local_278;
  }
  MatrixProperties::computemuBI(__return_storage_ptr__);
  if (local_270 != local_260) {
    operator_delete(local_270);
  }
  std::ifstream::~ifstream(&local_238);
  return __return_storage_ptr__;
}

Assistant:

MatrixProperties parseSparseMatrix(string path, int resolution, string chrom) {
    MatrixProperties prop;
    int M=0;
    int n;

    {
        ifstream file(path);
        if (!file.good()) {
            std::cerr << "Couldn't read file: " << path << std::endl;
            std::exit(1);
        }
        assert(file.good());

        string line;
        int v, w;
        double count;
        int maxv = 0;
        while ( file >> v >> w >> count )  {
            if (v > maxv) maxv = v;
            if (w > maxv) maxv = w;
            M++;
        }
        n = maxv/resolution+1;
        prop.chrom = chrom;
        prop.resolution = resolution;
        cerr << "Building matrix for chromosome " << prop.chrom << " at resolution " << prop.resolution << "bp with " << n << " rows." << endl;
    }

    cerr << "Initializing matrix to zero elements" << endl;
    prop.matrix = std::make_shared<SparseMatrix>(n,n,M);

    for (auto i = 0; i < n; i++) {
        for (auto j = 0; j < n; j++) {
            prop.matrix->insert_element(i,j, 0.0);
        }
    }
    
    ifstream file(path);
    string line;
    int v, w;
    double count;
    int m = 0;
    while ( file >> v >> w >> count )  {
        size_t i = v/resolution;
        size_t j = w/resolution;
        //prop.matrix->insert_element(i, j, log(count));
        prop.matrix->insert_element(i, j, count);
        m++;
        //if ( m % 100000 == 0 ) { std::cerr << "" << float(m)/M*100 << "%\n"; }
    }

    prop.computemuBI();
    return prop;
}